

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O0

void SSL_SESSION_get0_ocsp_response(SSL_SESSION *session,uint8_t **out,size_t *out_len)

{
  bool bVar1;
  pointer pcVar2;
  uint8_t *puVar3;
  size_t sVar4;
  size_t *out_len_local;
  uint8_t **out_local;
  SSL_SESSION *session_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&session->ocsp_response);
  if (bVar1) {
    pcVar2 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                       (&session->ocsp_response);
    puVar3 = CRYPTO_BUFFER_data(pcVar2);
    *out = puVar3;
    pcVar2 = std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get
                       (&session->ocsp_response);
    sVar4 = CRYPTO_BUFFER_len(pcVar2);
    *out_len = sVar4;
  }
  else {
    *out = (uint8_t *)0x0;
    *out_len = 0;
  }
  return;
}

Assistant:

void SSL_SESSION_get0_ocsp_response(const SSL_SESSION *session,
                                    const uint8_t **out, size_t *out_len) {
  if (session->ocsp_response) {
    *out = CRYPTO_BUFFER_data(session->ocsp_response.get());
    *out_len = CRYPTO_BUFFER_len(session->ocsp_response.get());
  } else {
    *out = nullptr;
    *out_len = 0;
  }
}